

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool _aborting_local;
  string *_stdErr_local;
  string *_stdOut_local;
  Totals *_totals_local;
  TestCaseInfo *_testInfo_local;
  TestCaseStats *this_local;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00195928;
  TestCaseInfo::TestCaseInfo(&this->testInfo,_testInfo);
  sVar1 = (_totals->assertions).passed;
  sVar2 = (_totals->assertions).failed;
  sVar3 = (_totals->assertions).failedButOk;
  sVar4 = (_totals->testCases).passed;
  sVar5 = (_totals->testCases).failedButOk;
  (this->totals).testCases.failed = (_totals->testCases).failed;
  (this->totals).testCases.failedButOk = sVar5;
  (this->totals).assertions.failedButOk = sVar3;
  (this->totals).testCases.passed = sVar4;
  (this->totals).assertions.passed = sVar1;
  (this->totals).assertions.failed = sVar2;
  std::__cxx11::string::string((string *)&this->stdOut,(string *)_stdOut);
  std::__cxx11::string::string((string *)&this->stdErr,(string *)_stdErr);
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats(  TestCaseInfo const& _testInfo,
                        Totals const& _totals,
                        std::string const& _stdOut,
                        std::string const& _stdErr,
                        bool _aborting )
        : testInfo( _testInfo ),
            totals( _totals ),
            stdOut( _stdOut ),
            stdErr( _stdErr ),
            aborting( _aborting )
        {}